

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O2

int __thiscall
GF2::MP<6ul,GF2::MOGrlex<6ul>>::CompareNC<GF2::MOLex<6ul>>
          (MP<6ul,GF2::MOGrlex<6ul>> *this,MP<6UL,_GF2::MOLex<6UL>_> *polyRight)

{
  int iVar1;
  MP<6UL,_GF2::MOGrlex<6UL>_> poly;
  _List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> local_30;
  
  MP<GF2::MOLex<6ul>>((MP<6ul,GF2::MOGrlex<6ul>> *)&local_30,polyRight);
  iVar1 = MP<6UL,_GF2::MOGrlex<6UL>_>::Compare
                    ((MP<6UL,_GF2::MOGrlex<6UL>_> *)this,(MP<6UL,_GF2::MOGrlex<6UL>_> *)&local_30);
  std::__cxx11::_List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::_M_clear(&local_30);
  return iVar1;
}

Assistant:

int CompareNC(const MP<_n, _O1>& polyRight) const
	{
		// меняем порядок
		MP poly(polyRight);
		poly.SetOrder(_order);
		// сравниваем
		return Compare(poly);
	}